

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::writeFileLPBase
          (SPxLPBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  size_t len_f;
  ofstream tmp;
  undefined1 local_230 [519];
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  char *local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ofstream::ofstream(local_230,in_RSI,_S_out);
  sVar1 = strlen(local_10);
  if ((((sVar1 < 5) || (local_10[sVar1 - 1] != 's')) || (local_10[sVar1 - 2] != 'p')) ||
     ((local_10[sVar1 - 3] != 'm' || (local_10[sVar1 - 4] != '.')))) {
    (**(code **)(*in_RDI + 0x100))(in_RDI,local_230,local_18,local_20,local_28,local_29 & 1);
  }
  else {
    (**(code **)(*in_RDI + 0x108))(in_RDI,local_230,local_18,local_20,local_28,local_29 & 1);
  }
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

virtual void writeFileLPBase(const char* filename, const NameSet* rowNames = nullptr,
                                const NameSet* colNames = nullptr, const DIdxSet* p_intvars = nullptr,
                                const bool writeZeroObjective = false) const
   {

      std::ofstream tmp(filename);
      size_t len_f = strlen(filename);

      if(len_f > 4 && filename[len_f - 1] == 's' && filename[len_f - 2] == 'p'
            && filename[len_f - 3] == 'm' && filename[len_f - 4] == '.')
      {
         writeMPS(tmp, rowNames, colNames, p_intvars, writeZeroObjective);
      }
      else
      {
         writeLPF(tmp, rowNames, colNames, p_intvars, writeZeroObjective);
      }
   }